

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O1

ExtPrivkey * __thiscall
cfd::core::KeyData::GetExtPrivkey(ExtPrivkey *__return_storage_ptr__,KeyData *this)

{
  uint32_t uVar1;
  uint8_t uVar2;
  undefined3 uVar3;
  uint32_t uVar4;
  NetType NVar5;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->extprivkey_);
  uVar1 = (this->extprivkey_).fingerprint_;
  uVar2 = (this->extprivkey_).depth_;
  uVar3 = *(undefined3 *)&(this->extprivkey_).field_0x21;
  uVar4 = (this->extprivkey_).child_num_;
  __return_storage_ptr__->version_ = (this->extprivkey_).version_;
  __return_storage_ptr__->fingerprint_ = uVar1;
  __return_storage_ptr__->depth_ = uVar2;
  *(undefined3 *)&__return_storage_ptr__->field_0x21 = uVar3;
  __return_storage_ptr__->child_num_ = uVar4;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(__return_storage_ptr__->chaincode_).data_,&(this->extprivkey_).chaincode_.data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &__return_storage_ptr__->privkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(this->extprivkey_).privkey_)
  ;
  uVar3 = *(undefined3 *)&(this->extprivkey_).privkey_.field_0x19;
  NVar5 = (this->extprivkey_).privkey_.net_type_;
  (__return_storage_ptr__->privkey_).is_compressed_ = (this->extprivkey_).privkey_.is_compressed_;
  *(undefined3 *)&(__return_storage_ptr__->privkey_).field_0x19 = uVar3;
  (__return_storage_ptr__->privkey_).net_type_ = NVar5;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(__return_storage_ptr__->tweak_sum_).data_,&(this->extprivkey_).tweak_sum_.data_);
  return __return_storage_ptr__;
}

Assistant:

ExtPrivkey KeyData::GetExtPrivkey() const { return extprivkey_; }